

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

Statistics * __thiscall
asmjit::JitAllocator::statistics(Statistics *__return_storage_ptr__,JitAllocator *this)

{
  Impl *pIVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  JitAllocatorPrivateImpl *impl;
  bool bVar10;
  
  __return_storage_ptr__->_reservedSize = 0;
  __return_storage_ptr__->_overheadSize = 0;
  __return_storage_ptr__->_blockCount = 0;
  __return_storage_ptr__->_usedSize = 0;
  pIVar1 = this->_impl;
  if (pIVar1 != (Impl *)JitAllocatorImpl_none) {
    pthread_mutex_lock((pthread_mutex_t *)(pIVar1 + 1));
    lVar4._0_4_ = pIVar1[5].options;
    lVar4._4_4_ = pIVar1[5].blockSize;
    lVar5 = 0x30;
    sVar3 = 0;
    sVar6 = 0;
    sVar8 = 0;
    sVar7 = 0;
    while (bVar10 = lVar4 != 0, lVar4 = lVar4 + -1, bVar10) {
      lVar2 = *(long *)&pIVar1[4].granularity;
      sVar7 = sVar7 + *(uint *)(lVar2 + -0x18 + lVar5);
      uVar9 = (ulong)*(ushort *)(lVar2 + -0x14 + lVar5);
      sVar8 = sVar8 + *(long *)(lVar2 + -0x10 + lVar5) * uVar9;
      sVar6 = sVar6 + uVar9 * *(long *)(lVar2 + -8 + lVar5);
      sVar3 = sVar3 + *(long *)(lVar2 + lVar5);
      lVar5 = lVar5 + 0x38;
    }
    __return_storage_ptr__->_reservedSize = sVar8;
    __return_storage_ptr__->_usedSize = sVar6;
    __return_storage_ptr__->_overheadSize = sVar3;
    __return_storage_ptr__->_blockCount = sVar7;
    pthread_mutex_unlock((pthread_mutex_t *)(pIVar1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

JitAllocator::Statistics JitAllocator::statistics() const noexcept {
  Statistics statistics;
  statistics.reset();

  if (ASMJIT_LIKELY(_impl != &JitAllocatorImpl_none)) {
    JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
    LockGuard guard(impl->lock);

    size_t poolCount = impl->poolCount;
    for (size_t poolId = 0; poolId < poolCount; poolId++) {
      const JitAllocatorPool& pool = impl->pools[poolId];
      statistics._blockCount   += size_t(pool.blockCount);
      statistics._reservedSize += size_t(pool.totalAreaSize) * pool.granularity;
      statistics._usedSize     += size_t(pool.totalAreaUsed) * pool.granularity;
      statistics._overheadSize += size_t(pool.totalOverheadBytes);
    }
  }

  return statistics;
}